

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

bool __thiscall HModel::nonbasicFlagBasicIndex_OK(HModel *this,int XnumCol,int XnumRow)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar1 = XnumCol + XnumRow;
  if (uVar1 == 0 || SCARRY4(XnumCol,XnumRow) != (int)uVar1 < 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar4] == 0);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (iVar2 == XnumRow) {
    if (XnumRow < 1) {
      return true;
    }
    lVar3 = 0;
    do {
      bVar5 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3]] == 0;
      if (!bVar5) {
        return bVar5;
      }
      bVar6 = (ulong)(uint)XnumRow - 1 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar6);
    return bVar5;
  }
  return false;
}

Assistant:

bool HModel::nonbasicFlagBasicIndex_OK(int XnumCol, int XnumRow) {
  assert(XnumCol >= 0);
  assert(XnumRow >= 0);
  //  printf("Called nonbasicFlagBasicIndex_OK(%d, %d)\n", XnumCol, XnumRow);cout << flush;
  int XnumTot = XnumCol + XnumRow;
  int numBasic = 0;
  if (XnumTot > 0) {
    for (int var=0; var < XnumTot; var++) if (!nonbasicFlag[var]) numBasic++;
  }
  assert(numBasic == XnumRow);
  if (numBasic != XnumRow) return false;
  if (XnumRow > 0) {
    for (int row=0; row < XnumRow; row++) {
      assert(!nonbasicFlag[basicIndex[row]]);
      if (nonbasicFlag[basicIndex[row]]) return false;
    }
  }
  return true;
}